

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractTypeRefining.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_103::AbstractTypeRefining::computeAbstractTypes
          (AbstractTypeRefining *this,SubTypes *subTypes)

{
  __node_base_ptr this_00;
  bool bVar1;
  size_type sVar2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *this_01;
  size_type sVar3;
  const_reference __u;
  reference pHVar4;
  HeapType *pHVar5;
  pointer ppVar6;
  mapped_type *pmVar7;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true> local_160;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true> local_158;
  iterator iter;
  key_type local_148;
  HeapType subType;
  const_iterator __end5;
  const_iterator __begin5;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range5;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *typeSubTypes;
  optional<wasm::HeapType> refinedType;
  HeapType type_1;
  Iterator __end2_1;
  Iterator __begin2_1;
  SubTypesFirstSort *__range2_1;
  key_type local_70;
  HeapType type;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range2;
  Types abstractTypes;
  SubTypes *subTypes_local;
  AbstractTypeRefining *this_local;
  
  abstractTypes._M_h._M_single_bucket = (__node_base_ptr)subTypes;
  std::
  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
  ::unordered_set((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                   *)&__range2);
  this_00 = abstractTypes._M_h._M_single_bucket;
  __end2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin
                     ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                      abstractTypes._M_h._M_single_bucket);
  type.id = (uintptr_t)
            std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end
                      ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                     *)&type), bVar1) {
    pHVar4 = __gnu_cxx::
             __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
             ::operator*(&__end2);
    local_70.id = pHVar4->id;
    sVar2 = std::
            unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
            ::count(&this->createdTypes,&local_70);
    if (sVar2 == 0) {
      std::
      unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
      ::insert((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                *)&__range2,&local_70);
    }
    __gnu_cxx::
    __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
    ::operator++(&__end2);
  }
  SubTypes::getSubTypesFirstSort
            ((SubTypesFirstSort *)&__begin2_1,(SubTypes *)abstractTypes._M_h._M_single_bucket);
  __end2_1 = TopologicalSort<wasm::HeapType,_SubTypesFirstSort>::begin
                       ((TopologicalSort<wasm::HeapType,_SubTypesFirstSort> *)&__begin2_1);
  type_1.id = (uintptr_t)
              TopologicalSort<wasm::HeapType,_SubTypesFirstSort>::end
                        ((TopologicalSort<wasm::HeapType,_SubTypesFirstSort> *)&__begin2_1);
  do {
    bVar1 = TopologicalSort<wasm::HeapType,_SubTypesFirstSort>::Iterator::operator!=
                      (&__end2_1,(Iterator *)&type_1);
    if (!bVar1) {
      SubTypes::getSubTypesFirstSort::SubTypesFirstSort::~SubTypesFirstSort
                ((SubTypesFirstSort *)&__begin2_1);
      std::
      unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
      ::~unordered_set((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                        *)&__range2);
      return;
    }
    refinedType.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::HeapType>._8_8_ =
         TopologicalSort<wasm::HeapType,_SubTypesFirstSort>::Iterator::operator*(&__end2_1);
    sVar2 = std::
            unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
            ::count((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                     *)&__range2,
                    (key_type *)
                    &refinedType.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::HeapType>._M_engaged);
    if (sVar2 != 0) {
      std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)&typeSubTypes);
      this_01 = SubTypes::getStrictSubTypes
                          ((SubTypes *)abstractTypes._M_h._M_single_bucket,
                           (HeapType)
                           refinedType.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                           super__Optional_payload_base<wasm::HeapType>._8_8_);
      sVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size(this_01);
      if (sVar3 == 1) {
        __u = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[](this_01,0);
        std::optional<wasm::HeapType>::operator=((optional<wasm::HeapType> *)&typeSubTypes,__u);
      }
      else {
        bVar1 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::empty(this_01);
        if (!bVar1) {
          __end5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin(this_01);
          subType.id = (uintptr_t)
                       std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end(this_01);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                             *)&subType), bVar1) {
            pHVar4 = __gnu_cxx::
                     __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                     ::operator*(&__end5);
            local_148.id = pHVar4->id;
            sVar2 = std::
                    unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                    ::count(&this->createdTypesOrSubTypes,&local_148);
            if (sVar2 != 0) {
              bVar1 = std::optional::operator_cast_to_bool((optional *)&typeSubTypes);
              if (bVar1) {
                std::optional<wasm::HeapType>::operator=((optional<wasm::HeapType> *)&typeSubTypes);
                break;
              }
              std::optional<wasm::HeapType>::operator=
                        ((optional<wasm::HeapType> *)&typeSubTypes,&local_148);
            }
            __gnu_cxx::
            __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
            ::operator++(&__end5);
          }
        }
      }
      bVar1 = std::optional::operator_cast_to_bool((optional *)&typeSubTypes);
      if (bVar1) {
        pHVar5 = std::optional<wasm::HeapType>::operator*((optional<wasm::HeapType> *)&typeSubTypes)
        ;
        local_158._M_cur =
             (__node_type *)
             std::
             unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
             ::find(&this->refinableTypes,pHVar5);
        local_160._M_cur =
             (__node_type *)
             std::
             unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
             ::end(&this->refinableTypes);
        bVar1 = std::__detail::operator!=(&local_158,&local_160);
        if (bVar1) {
          ppVar6 = std::__detail::
                   _Node_iterator<std::pair<const_wasm::HeapType,_wasm::HeapType>,_false,_true>::
                   operator->((_Node_iterator<std::pair<const_wasm::HeapType,_wasm::HeapType>,_false,_true>
                               *)&local_158);
          pHVar5 = std::optional<wasm::HeapType>::operator*
                             ((optional<wasm::HeapType> *)&typeSubTypes);
          pHVar5->id = (ppVar6->second).id;
        }
        pHVar5 = std::optional<wasm::HeapType>::operator*((optional<wasm::HeapType> *)&typeSubTypes)
        ;
        pmVar7 = std::
                 unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
                 ::operator[](&this->refinableTypes,
                              (key_type *)
                              &refinedType.super__Optional_base<wasm::HeapType,_true,_true>.
                               _M_payload.super__Optional_payload_base<wasm::HeapType>._M_engaged);
        pmVar7->id = pHVar5->id;
      }
    }
    TopologicalSort<wasm::HeapType,_SubTypesFirstSort>::Iterator::operator++(&__end2_1);
  } while( true );
}

Assistant:

void computeAbstractTypes(const SubTypes& subTypes) {
    // Abstract types are those with no news, i.e., the complement of
    // |createdTypes|. As mentioned above, we can only optimize this case if
    // traps never happen.
    // TODO: We could do some of this even if traps are possible. If an abstract
    //       type has no casts at all, then no traps are relevant, and we could
    //       remove it from the module. That might also make sense in MergeTypes
    //       perhaps (which atm will not merge such types if they add fields,
    //       in particular).
    Types abstractTypes;
    for (auto type : subTypes.types) {
      if (createdTypes.count(type) == 0) {
        abstractTypes.insert(type);
      }
    }

    // We found abstract types. Next, find which of them are refinable. We
    // need an abstract type to have a single subtype, to which we will switch
    // all of their casts.
    //
    // Do this depth-first, so that we visit subtypes first. That will handle
    // chains where we want to refine a type A to a subtype of a subtype of
    // it.
    for (auto type : subTypes.getSubTypesFirstSort()) {
      if (!abstractTypes.count(type)) {
        continue;
      }

      std::optional<HeapType> refinedType;
      auto& typeSubTypes = subTypes.getStrictSubTypes(type);
      if (typeSubTypes.size() == 1) {
        // There is only a single possibility, so we can definitely use that
        /// one.
        refinedType = typeSubTypes[0];
      } else if (!typeSubTypes.empty()) {
        // There are multiple possibilities. However, perhaps only one of them
        // is relevant, if nothing is ever created of the others or their
        // subtypes.
        for (auto subType : typeSubTypes) {
          if (createdTypesOrSubTypes.count(subType)) {
            if (!refinedType) {
              // This is the first relevant thing, and hopefully will remain
              // the only one.
              refinedType = subType;
            } else {
              // We've seen more than one as relevant, so we have failed to
              // find a singleton.
              refinedType = std::nullopt;
              break;
            }
          }
        }
      }
      if (refinedType) {
        // Propagate anything from the child, to handle chains.
        auto iter = refinableTypes.find(*refinedType);
        if (iter != refinableTypes.end()) {
          *refinedType = iter->second;
        }

        refinableTypes[type] = *refinedType;
      }
    }
  }